

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateParsingConstructor
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  int iVar1;
  FieldGenerator *pFVar2;
  FieldDescriptor **ppFVar3;
  Descriptor *pDVar4;
  uint i;
  uint i_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  string local_58;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_38;
  
  local_38.array_ = anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  io::Printer::Print(printer,
                     "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"initFields();\n");
  pDVar4 = this->descriptor_;
  if (*(int *)(pDVar4 + 0x2c) < 1) {
    iVar7 = 0;
    uVar5 = extraout_RDX;
  }
  else {
    lVar10 = 0;
    lVar12 = 0;
    iVar7 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar10));
      iVar1 = (*pFVar2->_vptr_FieldGenerator[3])(pFVar2);
      iVar7 = iVar7 + iVar1;
      lVar12 = lVar12 + 1;
      pDVar4 = this->descriptor_;
      lVar10 = lVar10 + 0x78;
      uVar5 = extraout_RDX_00;
    } while (lVar12 < *(int *)(pDVar4 + 0x2c));
  }
  if (0 < iVar7) {
    uVar8 = iVar7 + 0x1fU >> 5;
    uVar11 = 1;
    if (1 < uVar8) {
      uVar11 = uVar8;
    }
    uVar8 = 0;
    do {
      GetBitFieldName_abi_cxx11_(&local_58,(java *)(ulong)uVar8,(int)uVar5);
      io::Printer::Print(printer,"int mutable_$bit_field_name$ = 0;\n","bit_field_name",&local_58);
      uVar5 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        uVar5 = extraout_RDX_02;
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n    com.google.protobuf.UnknownFieldSet.newBuilder();\n"
                      );
  }
  io::Printer::Print(printer,"try {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int tag = input.readTag();\nswitch (tag) {\n");
  io::Printer::Indent(printer);
  iVar7 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  pcVar9 = " unknownFields,";
  if (iVar7 == 3) {
    pcVar9 = "";
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar6 = pcVar9 + 0xf;
  if (iVar7 == 3) {
    pcVar6 = pcVar9;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar9,pcVar6);
  io::Printer::Print(printer,
                     "case 0:\n  done = true;\n  break;\ndefault: {\n  if (!parseUnknownField(input,$unknown_fields$\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
                     ,"unknown_fields",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    lVar10 = 0;
    do {
      ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_38,lVar10);
      field = *ppFVar3;
      SimpleItoa_abi_cxx11_
                (&local_58,
                 (protobuf *)
                 (ulong)(*(int *)(field + 0x28) << 3 |
                        *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                 (ulong)*(uint *)(field + 0x2c) * 4)),i);
      io::Printer::Print(printer,"case $tag$: {\n","tag",&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Indent(printer);
      pFVar2 = FieldGeneratorMap::get(&this->field_generators_,field);
      (*pFVar2->_vptr_FieldGenerator[0xb])(pFVar2,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  break;\n}\n");
      if ((*(int *)(field + 0x30) == 3) && (*(int *)(field + 0x2c) - 0xdU < 0xfffffffc)) {
        SimpleItoa_abi_cxx11_(&local_58,(protobuf *)(ulong)(*(int *)(field + 0x28) * 8 + 2),i_00);
        io::Printer::Print(printer,"case $tag$: {\n","tag",&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        io::Printer::Indent(printer);
        pFVar2 = FieldGeneratorMap::get(&this->field_generators_,field);
        (*pFVar2->_vptr_FieldGenerator[0xc])(pFVar2,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"  break;\n}\n");
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this->descriptor_ + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(this);\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e.getMessage()).setUnfinishedMessage(this);\n} finally {\n"
                    );
  io::Printer::Indent(printer);
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar10 = 0;
    do {
      ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_38,lVar10);
      pFVar2 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar3);
      (*pFVar2->_vptr_FieldGenerator[0xd])(pFVar2,printer);
      lVar10 = lVar10 + 1;
      pDVar4 = this->descriptor_;
    } while (lVar10 < *(int *)(pDVar4 + 0x2c));
  }
  if (*(int *)(*(long *)(*(long *)(pDVar4 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"this.unknownFields = unknownFields.build();\n");
  }
  io::Printer::Print(printer,"makeExtensionsImmutable();\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  if (local_38.array_ != (FieldDescriptor **)0x0) {
    operator_delete__(local_38.array_);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateParsingConstructor(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "initFields();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n"
    "default: {\n"
    "  if (!parseUnknownField(input,$unknown_fields$\n"
    "                         extensionRegistry, tag)) {\n"
    "    done = true;\n"  // it's an endgroup tag
    "  }\n"
    "  break;\n"
    "}\n",
    "unknown_fields", HasUnknownFields(descriptor_)
        ? " unknownFields," : "");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(tag));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(packed_tag));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e.getMessage()).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  // Make unknown fields immutable.
  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}